

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_audio_buffer_ref_get_available_frames
                    (ma_audio_buffer_ref *pAudioBufferRef,ma_uint64 *pAvailableFrames)

{
  ma_uint64 *pAvailableFrames_local;
  ma_audio_buffer_ref *pAudioBufferRef_local;
  
  if (pAvailableFrames == (ma_uint64 *)0x0) {
    pAudioBufferRef_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pAvailableFrames = 0;
    if (pAudioBufferRef == (ma_audio_buffer_ref *)0x0) {
      pAudioBufferRef_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      if (pAudioBufferRef->cursor < pAudioBufferRef->sizeInFrames) {
        *pAvailableFrames = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
      }
      else {
        *pAvailableFrames = 0;
      }
      pAudioBufferRef_local._4_4_ = MA_SUCCESS;
    }
  }
  return pAudioBufferRef_local._4_4_;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_get_available_frames(const ma_audio_buffer_ref* pAudioBufferRef, ma_uint64* pAvailableFrames)
{
    if (pAvailableFrames == NULL) {
        return MA_INVALID_ARGS;
    }

    *pAvailableFrames = 0;

    if (pAudioBufferRef == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pAudioBufferRef->sizeInFrames <= pAudioBufferRef->cursor) {
        *pAvailableFrames = 0;
    } else {
        *pAvailableFrames = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
    }

    return MA_SUCCESS;
}